

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint8_t uVar1;
  int iVar2;
  
  uVar1 = IT8951_Init();
  if (uVar1 == '\0') {
    iVar2 = 0;
    IT8951WaitForDisplayReady();
    if (argc != 2) {
      puts("Error: argc!=2.");
      exit(1);
    }
    IT8951_BMP_Example(0,0,argv[1]);
    IT8951_Cancel();
  }
  else {
    puts("IT8951_Init error ");
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main (int argc, char *argv[])
{
	if(IT8951_Init())
	{
		printf("IT8951_Init error \n");
		return 1;
	}

    IT8951WaitForDisplayReady();

	if (argc != 2)
	{
		printf("Error: argc!=2.\n");
		exit(1);
	}

	IT8951_BMP_Example(0, 0,argv[1]);
	
	IT8951_Cancel();

	return 0;
}